

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O2

void __thiscall MeshLib::SolidDelegate::removeFace2(SolidDelegate *this,Solid *pS,Face *f)

{
  HalfEdge *pHVar1;
  Vertex *v;
  undefined8 *puVar2;
  HalfEdge *he;
  EditVertexTrait *pEVar3;
  undefined8 *puVar4;
  long *plVar5;
  long lVar6;
  HalfEdge *helist [3];
  FaceHalfedgeIterator fhiter;
  long local_58 [4];
  Face *local_38;
  HalfEdge *local_30;
  
  if (f != (Face *)0x0) {
    plVar5 = local_58;
    local_30 = f->m_halfedge;
    local_38 = f;
    while (local_30 != (HalfEdge *)0x0) {
      *plVar5 = (long)local_30;
      this = (SolidDelegate *)&local_38;
      FaceHalfedgeIterator::operator++((FaceHalfedgeIterator *)&local_38);
      plVar5 = plVar5 + 1;
    }
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pHVar1 = (HalfEdge *)local_58[lVar6];
      v = pHVar1->m_vertex;
      if (v->m_halfedge == pHVar1) {
        this = (SolidDelegate *)v;
        pEVar3 = trait<MeshLib::EditVertexTrait,MeshLib::Vertex>(v);
        puVar4 = *(undefined8 **)(pEVar3 + 0x30);
        do {
          puVar2 = (undefined8 *)*puVar4;
          if (puVar2 == (undefined8 *)0x0) goto LAB_00113910;
          puVar4 = puVar2 + 1;
        } while ((HalfEdge *)*puVar2 == pHVar1);
        v->m_halfedge = (HalfEdge *)*puVar2;
      }
LAB_00113910:
    }
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      removeHalfedge(this,pS,(HalfEdge *)local_58[lVar6]);
    }
    AVL::Tree<MeshLib::Face>::remove(&pS->m_faces,(char *)f);
    if (f->m_trait != (Trait *)0x0) {
      Trait::clear(&f->m_trait);
    }
    std::__cxx11::string::~string((string *)&f->m_string);
    operator_delete(f);
  }
  return;
}

Assistant:

void SolidDelegate::removeFace2(Solid *pS,  Face * f )
{
	if( f == NULL ) return;

	HalfEdge * helist[3];

	int i =0;
	for( FaceHalfedgeIterator fhiter(f); !fhiter.end(); ++fhiter)
	{
		HalfEdge * he = *fhiter;
		helist[i] = he;
		i++;
	}
	
	for( i =0; i < 3; i++)
	{
		Vertex *vt = helist[i]->target();
		if( vt->halfedge() == helist[i])
		{
			for( ListIterator<HalfEdge> liter( *v_edit_halfedge(vt)); !liter.end(); ++liter)
			{
				HalfEdge *he = *liter;
				if( he != helist[i])
				{
					vt->halfedge() = he;
					break;
				}
			}
		}
	}
	for( i = 0; i < 3; i ++ )
	{
		removeHalfedge(pS, helist[i] );
	}


	pS->m_faces.remove( f );

	if( f->trait() != NULL )
	{
		Trait::clear( f->trait() );
	}
	delete f;
}